

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

Status __thiscall google::protobuf::File::CreateDir(File *this,string *name,int mode)

{
  string *psVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  string_view message;
  basic_string_view<char,_std::char_traits<char>_> local_58 [2];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  __mode_t local_1c;
  string *psStack_18;
  int mode_local;
  string *name_local;
  
  local_1c = mode;
  psStack_18 = name;
  name_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  psVar1 = psStack_18;
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    local_31 = 0;
    if (*pcVar4 == '.') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
                 ,0x72,"name[name.size() - 1] != \'.\'");
      local_31 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar5);
    }
    if ((local_31 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar4,local_1c);
  if (iVar2 == 0) {
    absl::lts_20250127::OkStatus();
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_58,"Failed to create directory");
    message._M_str = (char *)local_58[0]._M_len;
    message._M_len = (size_t)this;
    absl::lts_20250127::InternalError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status File::CreateDir(const std::string& name, int mode) {
  if (!name.empty()) {
    ABSL_CHECK(name[name.size() - 1] != '.');
  }
  if (mkdir(name.c_str(), mode) != 0) {
    return absl::InternalError("Failed to create directory");
  }
  return absl::OkStatus();
}